

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  int iVar3;
  pointer pBVar4;
  iterator __position;
  int *piVar5;
  void *pvVar6;
  Allocator *pAVar7;
  pointer pMVar8;
  long *plVar9;
  int iVar10;
  int iVar11;
  Layer *pLVar12;
  Net *pNVar13;
  int iVar14;
  size_t sVar15;
  size_t *psVar16;
  long lVar17;
  int *piVar18;
  long lVar19;
  int top_count;
  int bottom_count;
  int blob_count;
  int layer_count;
  int magic;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  ParamDict pd;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  Mat local_cd8;
  Layer *local_c90;
  int local_c88;
  int local_c84;
  ulong local_c80;
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *local_c78;
  Net *local_c70;
  DataReader *local_c68;
  vector<int,_std::allocator<int>_> *local_c60;
  int local_c54;
  vector<int,_std::allocator<int>_> *local_c50;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c48;
  ulong local_c40;
  Mat local_c38 [4];
  char local_b38 [256];
  char local_a38 [264];
  ParamDict local_930;
  
  local_c54 = 0;
  local_c70 = this;
  iVar14 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar14 == 1) {
    if (local_c54 == 0x7685dd) {
      local_c84 = 0;
      local_c88 = 0;
      iVar14 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar14 == 1) {
        iVar14 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_c88);
        pNVar13 = local_c70;
        if (iVar14 == 1) {
          if ((0 < (long)local_c84) && (0 < local_c88)) {
            local_c48 = &local_c70->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_c48,(long)local_c84);
            local_c78 = &pNVar13->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(local_c78,(long)local_c88);
            ParamDict::ParamDict(&local_930);
            local_cdc = 0;
            if (0 < local_c84) {
              local_c80 = 0;
              local_c68 = dr;
              do {
                psVar16 = &local_c38[0].elemsize;
                local_ce0 = 0;
                local_ce4 = 0;
                iVar14 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_b38);
                if (iVar14 != 1) {
                  load_param();
LAB_0012c930:
                  iVar14 = -1;
                  goto LAB_0012c935;
                }
                iVar14 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_a38);
                if (iVar14 != 1) {
                  load_param();
                  goto LAB_0012c930;
                }
                iVar14 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_ce0);
                if (iVar14 != 1) {
                  load_param();
                  goto LAB_0012c930;
                }
                iVar14 = (*dr->_vptr_DataReader[2])(dr,"%d",&local_ce4);
                if (iVar14 != 1) {
                  load_param();
                  goto LAB_0012c930;
                }
                local_c90 = create_layer(local_b38);
                if ((local_c90 == (Layer *)0x0) &&
                   (local_c90 = create_custom_layer(local_c70,local_b38), local_c90 == (Layer *)0x0)
                   ) {
                  fprintf(_stderr,"layer %s not exists or registered",local_b38);
                  fputc(10,_stderr);
                  clear(local_c70);
                  goto LAB_0012c930;
                }
                local_c38[0].data = psVar16;
                sVar15 = strlen(local_b38);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c38,local_b38,local_b38 + sVar15);
                std::__cxx11::string::operator=((string *)&local_c90->type,(string *)local_c38);
                if ((size_t *)local_c38[0].data != psVar16) {
                  operator_delete(local_c38[0].data,local_c38[0].elemsize + 1);
                }
                local_c38[0].data = psVar16;
                sVar15 = strlen(local_a38);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c38,local_a38,local_a38 + sVar15);
                std::__cxx11::string::operator=((string *)&local_c90->name,(string *)local_c38);
                if ((size_t *)local_c38[0].data != psVar16) {
                  operator_delete(local_c38[0].data,local_c38[0].elemsize + 1);
                }
                local_c50 = &local_c90->bottoms;
                std::vector<int,_std::allocator<int>_>::resize(local_c50,(long)local_ce0);
                if (0 < local_ce0) {
                  lVar17 = 0;
                  do {
                    iVar14 = (*dr->_vptr_DataReader[2])(dr,"%255s",local_c38);
                    if (iVar14 != 1) {
                      load_param();
                      goto LAB_0012c930;
                    }
                    iVar14 = find_blob_index_by_name(local_c70,(char *)local_c38);
                    if (iVar14 == -1) {
                      pBVar4 = (local_c78->
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      local_cd8.data = &local_cd8.elemsize;
                      sVar15 = strlen((char *)local_c38);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_cd8,local_c38,(long)&local_c38[0].data + sVar15);
                      lVar19 = (long)(int)local_c80;
                      std::__cxx11::string::operator=
                                ((string *)(pBVar4 + lVar19),(string *)&local_cd8);
                      if ((size_t *)local_cd8.data != &local_cd8.elemsize) {
                        operator_delete(local_cd8.data,
                                        CONCAT44(local_cd8.elemsize._4_4_,
                                                 (undefined4)local_cd8.elemsize) + 1);
                      }
                      iVar14 = (int)local_c80;
                      local_c80 = (ulong)(iVar14 + 1);
                      dr = local_c68;
                    }
                    else {
                      lVar19 = (long)iVar14;
                    }
                    pBVar4 = (local_c78->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    __position._M_current =
                         pBVar4[lVar19].consumers.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    if (__position._M_current ==
                        pBVar4[lVar19].consumers.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&pBVar4[lVar19].consumers,
                                 __position,&local_cdc);
                    }
                    else {
                      *__position._M_current = local_cdc;
                      pBVar4[lVar19].consumers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_finish = __position._M_current + 1;
                    }
                    (local_c50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar17] = iVar14;
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < local_ce0);
                }
                local_c60 = &local_c90->tops;
                std::vector<int,_std::allocator<int>_>::resize(local_c60,(long)local_ce4);
                if (0 < local_ce4) {
                  local_c40 = local_c80 & 0xffffffff;
                  lVar19 = (long)(int)local_c80 << 7;
                  lVar17 = 0;
                  do {
                    pBVar4 = (local_c78->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    iVar14 = (*local_c68->_vptr_DataReader[2])(local_c68,"%255s",local_c38);
                    if (iVar14 != 1) {
                      load_param();
                      goto LAB_0012c930;
                    }
                    local_cd8.data = &local_cd8.elemsize;
                    sVar15 = strlen((char *)local_c38);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_cd8,local_c38,(long)&local_c38[0].data + sVar15);
                    std::__cxx11::string::operator=
                              ((string *)((long)&(pBVar4->name)._M_dataplus._M_p + lVar19),
                               (string *)&local_cd8);
                    if ((size_t *)local_cd8.data != &local_cd8.elemsize) {
                      operator_delete(local_cd8.data,
                                      CONCAT44(local_cd8.elemsize._4_4_,
                                               (undefined4)local_cd8.elemsize) + 1);
                    }
                    *(int *)((long)&pBVar4->producer + lVar19) = local_cdc;
                    (local_c60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar17] = (int)local_c40 + (int)lVar17;
                    lVar17 = lVar17 + 1;
                    lVar19 = lVar19 + 0x80;
                  } while (lVar17 < local_ce4);
                  local_c80 = (ulong)(uint)((int)local_c80 + (int)lVar17);
                  dr = local_c68;
                }
                iVar14 = ParamDict::load_param(&local_930,dr);
                if (iVar14 == 0) {
                  local_cd8.elemsize._0_4_ = 0;
                  local_cd8.elemsize._4_4_ = 0;
                  local_cd8.elempack = 0;
                  local_cd8.data = (size_t *)0x0;
                  local_cd8.refcount._0_4_ = 0;
                  local_cd8.refcount._4_4_ = 0;
                  local_cd8.h = 0;
                  local_cd8.c = 0;
                  local_cd8.cstep = 0;
                  local_cd8.allocator = (Allocator *)0x0;
                  local_cd8.dims = 0;
                  local_cd8.w = 0;
                  ParamDict::get(local_c38,&local_930,0x1e,&local_cd8);
                  piVar18 = (int *)CONCAT44(local_cd8.refcount._4_4_,local_cd8.refcount._0_4_);
                  if (piVar18 != (int *)0x0) {
                    LOCK();
                    *piVar18 = *piVar18 + -1;
                    UNLOCK();
                    if (*piVar18 == 0) {
                      if (local_cd8.allocator == (Allocator *)0x0) {
                        if ((size_t *)local_cd8.data != (size_t *)0x0) {
                          free(local_cd8.data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_cd8.allocator + 0x18))();
                      }
                    }
                  }
                  if ((((size_t *)local_c38[0].data != (size_t *)0x0) &&
                      ((long)local_c38[0].c * local_c38[0].cstep != 0)) && (0 < local_ce4)) {
                    piVar18 = (int *)((long)local_c38[0].data + 8);
                    lVar17 = 0;
                    do {
                      iVar14 = (local_c60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[lVar17];
                      pBVar4 = (local_c78->
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      iVar3 = (int)*(size_t *)(piVar18 + -2);
                      if (iVar3 == 3) {
                        local_cd8._48_8_ = *(undefined8 *)piVar18;
                        local_cd8.data = (size_t *)0x0;
                        local_cd8.refcount._0_4_ = 0;
                        local_cd8.refcount._4_4_ = 0;
                        local_cd8.elemsize._0_4_ = 4;
                        local_cd8.elemsize._4_4_ = 0;
                        local_cd8.elempack = 1;
                        local_cd8.allocator = (Allocator *)0x0;
                        local_cd8.w = piVar18[-1];
                        local_cd8.dims = 3;
                        local_cd8.cstep =
                             (long)(local_cd8.h * piVar18[-1]) + 3U & 0x3ffffffffffffffc;
                        if (&pBVar4[iVar14].shape != &local_cd8) {
                          piVar5 = pBVar4[iVar14].shape.refcount;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar6 = pBVar4[iVar14].shape.data;
                              pAVar7 = pBVar4[iVar14].shape.allocator;
                              if (pAVar7 == (Allocator *)0x0) {
                                if (pvVar6 != (void *)0x0) {
                                  free(pvVar6);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar7 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.elemsize + 4) = 0;
                          pBVar4[iVar14].shape.data = (void *)0x0;
                          pBVar4[iVar14].shape.refcount = (int *)0x0;
                          pBVar4[iVar14].shape.dims = 0;
                          pBVar4[iVar14].shape.w = 0;
                          pBVar4[iVar14].shape.h = 0;
                          pBVar4[iVar14].shape.c = 0;
                          pBVar4[iVar14].shape.cstep = 0;
                          pBVar4[iVar14].shape.data = local_cd8.data;
                          piVar5 = (int *)CONCAT44(local_cd8.refcount._4_4_,local_cd8.refcount._0_4_
                                                  );
                          pBVar4[iVar14].shape.refcount = piVar5;
                          pBVar4[iVar14].shape.elemsize =
                               CONCAT44(local_cd8.elemsize._4_4_,(undefined4)local_cd8.elemsize);
                          pBVar4[iVar14].shape.elempack = local_cd8.elempack;
                          pBVar4[iVar14].shape.allocator = local_cd8.allocator;
                          pBVar4[iVar14].shape.dims = local_cd8.dims;
                          pBVar4[iVar14].shape.w = local_cd8.w;
                          pBVar4[iVar14].shape.h = local_cd8.h;
                          pBVar4[iVar14].shape.c = local_cd8.c;
                          pBVar4[iVar14].shape.cstep = local_cd8.cstep;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              if (local_cd8.allocator == (Allocator *)0x0) {
LAB_0012c5e8:
                                if ((size_t *)local_cd8.data != (size_t *)0x0) {
                                  free(local_cd8.data);
                                }
                              }
                              else {
                                (**(code **)(*(long *)local_cd8.allocator + 0x18))();
                              }
                            }
                          }
                        }
                      }
                      else if (iVar3 == 2) {
                        local_cd8.data = (size_t *)0x0;
                        local_cd8.refcount._0_4_ = 0;
                        local_cd8.refcount._4_4_ = 0;
                        local_cd8.elemsize._0_4_ = 4;
                        local_cd8.elemsize._4_4_ = 0;
                        local_cd8.elempack = 1;
                        local_cd8.allocator = (Allocator *)0x0;
                        local_cd8.w = piVar18[-1];
                        local_cd8.dims = 2;
                        local_cd8.c = 1;
                        local_cd8.h = *piVar18;
                        local_cd8.cstep = (size_t)(*piVar18 * piVar18[-1]);
                        if (&pBVar4[iVar14].shape != &local_cd8) {
                          piVar5 = pBVar4[iVar14].shape.refcount;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar6 = pBVar4[iVar14].shape.data;
                              pAVar7 = pBVar4[iVar14].shape.allocator;
                              if (pAVar7 == (Allocator *)0x0) {
                                if (pvVar6 != (void *)0x0) {
                                  free(pvVar6);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar7 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.elemsize + 4) = 0;
                          pBVar4[iVar14].shape.data = (void *)0x0;
                          pBVar4[iVar14].shape.refcount = (int *)0x0;
                          pBVar4[iVar14].shape.dims = 0;
                          pBVar4[iVar14].shape.w = 0;
                          pBVar4[iVar14].shape.h = 0;
                          pBVar4[iVar14].shape.c = 0;
                          pBVar4[iVar14].shape.cstep = 0;
                          pBVar4[iVar14].shape.data = local_cd8.data;
                          piVar5 = (int *)CONCAT44(local_cd8.refcount._4_4_,local_cd8.refcount._0_4_
                                                  );
                          pBVar4[iVar14].shape.refcount = piVar5;
                          pBVar4[iVar14].shape.elemsize =
                               CONCAT44(local_cd8.elemsize._4_4_,(undefined4)local_cd8.elemsize);
                          pBVar4[iVar14].shape.elempack = local_cd8.elempack;
                          pBVar4[iVar14].shape.allocator = local_cd8.allocator;
                          pBVar4[iVar14].shape.dims = local_cd8.dims;
                          pBVar4[iVar14].shape.w = local_cd8.w;
                          pBVar4[iVar14].shape.h = local_cd8.h;
                          pBVar4[iVar14].shape.c = local_cd8.c;
                          pBVar4[iVar14].shape.cstep = local_cd8.cstep;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              if (local_cd8.allocator == (Allocator *)0x0) goto LAB_0012c5e8;
                              (**(code **)(*(long *)local_cd8.allocator + 0x18))();
                            }
                          }
                        }
                      }
                      else if (iVar3 == 1) {
                        local_cd8.cstep = (size_t)piVar18[-1];
                        local_cd8.data = (size_t *)0x0;
                        local_cd8.refcount._0_4_ = 0;
                        local_cd8.refcount._4_4_ = 0;
                        local_cd8.elemsize._0_4_ = 4;
                        local_cd8.elemsize._4_4_ = 0;
                        local_cd8.elempack = 1;
                        local_cd8.allocator = (Allocator *)0x0;
                        local_cd8.w = piVar18[-1];
                        local_cd8.dims = 1;
                        local_cd8.h = 1;
                        local_cd8.c = 1;
                        if (&pBVar4[iVar14].shape != &local_cd8) {
                          piVar5 = pBVar4[iVar14].shape.refcount;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              pvVar6 = pBVar4[iVar14].shape.data;
                              pAVar7 = pBVar4[iVar14].shape.allocator;
                              if (pAVar7 == (Allocator *)0x0) {
                                if (pvVar6 != (void *)0x0) {
                                  free(pvVar6);
                                }
                              }
                              else {
                                (**(code **)(*(long *)pAVar7 + 0x18))();
                              }
                            }
                          }
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.refcount + 4) = 0;
                          *(undefined8 *)((long)&pBVar4[iVar14].shape.elemsize + 4) = 0;
                          pBVar4[iVar14].shape.data = (void *)0x0;
                          pBVar4[iVar14].shape.refcount = (int *)0x0;
                          pBVar4[iVar14].shape.dims = 0;
                          pBVar4[iVar14].shape.w = 0;
                          pBVar4[iVar14].shape.h = 0;
                          pBVar4[iVar14].shape.c = 0;
                          pBVar4[iVar14].shape.cstep = 0;
                          pBVar4[iVar14].shape.data = local_cd8.data;
                          piVar5 = (int *)CONCAT44(local_cd8.refcount._4_4_,local_cd8.refcount._0_4_
                                                  );
                          pBVar4[iVar14].shape.refcount = piVar5;
                          pBVar4[iVar14].shape.elemsize =
                               CONCAT44(local_cd8.elemsize._4_4_,(undefined4)local_cd8.elemsize);
                          pBVar4[iVar14].shape.elempack = local_cd8.elempack;
                          pBVar4[iVar14].shape.allocator = local_cd8.allocator;
                          pBVar4[iVar14].shape.dims = local_cd8.dims;
                          pBVar4[iVar14].shape.w = local_cd8.w;
                          pBVar4[iVar14].shape.h = local_cd8.h;
                          pBVar4[iVar14].shape.c = local_cd8.c;
                          pBVar4[iVar14].shape.cstep = local_cd8.cstep;
                          if (piVar5 != (int *)0x0) {
                            LOCK();
                            *piVar5 = *piVar5 + -1;
                            UNLOCK();
                            if (*piVar5 == 0) {
                              if (local_cd8.allocator == (Allocator *)0x0) goto LAB_0012c5e8;
                              (**(code **)(*(long *)local_cd8.allocator + 0x18))();
                            }
                          }
                        }
                      }
                      lVar17 = lVar17 + 1;
                      piVar18 = piVar18 + 4;
                    } while (lVar17 < local_ce4);
                  }
                  pvVar1 = &local_c90->bottom_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_ce0)
                  ;
                  if (0 < local_ce0) {
                    lVar17 = 0;
                    lVar19 = 0;
                    iVar14 = local_ce0;
                    do {
                      iVar3 = (local_c50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar19];
                      pBVar4 = (local_c78->
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar8 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar8->data + lVar17);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar18 = pBVar4[iVar3].shape.refcount;
                        if (piVar18 != (int *)0x0) {
                          LOCK();
                          *piVar18 = *piVar18 + 1;
                          UNLOCK();
                        }
                        piVar18 = *(int **)((long)&pMVar8->refcount + lVar17);
                        if (piVar18 != (int *)0x0) {
                          LOCK();
                          *piVar18 = *piVar18 + -1;
                          UNLOCK();
                          if (*piVar18 == 0) {
                            pvVar6 = *(void **)((long)&pMVar8->data + lVar17);
                            plVar9 = *(long **)((long)&pMVar8->allocator + lVar17);
                            if (plVar9 == (long *)0x0) {
                              if (pvVar6 != (void *)0x0) {
                                free(pvVar6);
                              }
                            }
                            else {
                              (**(code **)(*plVar9 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar17);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined8 *)((long)&pMVar8->cstep + lVar17) = 0;
                        piVar18 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar8->data + lVar17);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar18;
                        *(size_t *)((long)&pMVar8->elemsize + lVar17) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar8->elempack + lVar17) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar8->allocator + lVar17) =
                             pBVar4[iVar3].shape.allocator;
                        iVar14 = pBVar4[iVar3].shape.w;
                        iVar10 = pBVar4[iVar3].shape.h;
                        iVar11 = pBVar4[iVar3].shape.c;
                        piVar18 = (int *)((long)&pMVar8->dims + lVar17);
                        *piVar18 = pBVar4[iVar3].shape.dims;
                        piVar18[1] = iVar14;
                        piVar18[2] = iVar10;
                        piVar18[3] = iVar11;
                        *(size_t *)((long)&pMVar8->cstep + lVar17) = pBVar4[iVar3].shape.cstep;
                        iVar14 = local_ce0;
                      }
                      lVar19 = lVar19 + 1;
                      lVar17 = lVar17 + 0x40;
                    } while (lVar19 < iVar14);
                  }
                  pvVar1 = &local_c90->top_shapes;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)local_ce4)
                  ;
                  if (0 < local_ce4) {
                    lVar19 = 0;
                    lVar17 = 0;
                    iVar14 = local_ce4;
                    do {
                      iVar3 = (local_c60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar17];
                      pBVar4 = (local_c78->
                               super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                               super__Vector_impl_data._M_start;
                      pMVar8 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                               _M_impl.super__Vector_impl_data._M_start;
                      puVar2 = (undefined8 *)((long)&pMVar8->data + lVar19);
                      if ((Mat *)puVar2 != &pBVar4[iVar3].shape) {
                        piVar18 = pBVar4[iVar3].shape.refcount;
                        if (piVar18 != (int *)0x0) {
                          LOCK();
                          *piVar18 = *piVar18 + 1;
                          UNLOCK();
                        }
                        piVar18 = *(int **)((long)&pMVar8->refcount + lVar19);
                        if (piVar18 != (int *)0x0) {
                          LOCK();
                          *piVar18 = *piVar18 + -1;
                          UNLOCK();
                          if (*piVar18 == 0) {
                            pvVar6 = *(void **)((long)&pMVar8->data + lVar19);
                            plVar9 = *(long **)((long)&pMVar8->allocator + lVar19);
                            if (plVar9 == (long *)0x0) {
                              if (pvVar6 != (void *)0x0) {
                                free(pvVar6);
                              }
                            }
                            else {
                              (**(code **)(*plVar9 + 0x18))();
                            }
                          }
                        }
                        *(undefined8 *)((long)puVar2 + 0xc) = 0;
                        *(undefined8 *)((long)puVar2 + 0x14) = 0;
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        puVar2 = (undefined8 *)((long)&pMVar8->dims + lVar19);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined8 *)((long)&pMVar8->cstep + lVar19) = 0;
                        piVar18 = pBVar4[iVar3].shape.refcount;
                        puVar2 = (undefined8 *)((long)&pMVar8->data + lVar19);
                        *puVar2 = pBVar4[iVar3].shape.data;
                        puVar2[1] = piVar18;
                        *(size_t *)((long)&pMVar8->elemsize + lVar19) = pBVar4[iVar3].shape.elemsize
                        ;
                        *(int *)((long)&pMVar8->elempack + lVar19) = pBVar4[iVar3].shape.elempack;
                        *(Allocator **)((long)&pMVar8->allocator + lVar19) =
                             pBVar4[iVar3].shape.allocator;
                        iVar14 = pBVar4[iVar3].shape.w;
                        iVar10 = pBVar4[iVar3].shape.h;
                        iVar11 = pBVar4[iVar3].shape.c;
                        piVar18 = (int *)((long)&pMVar8->dims + lVar19);
                        *piVar18 = pBVar4[iVar3].shape.dims;
                        piVar18[1] = iVar14;
                        piVar18[2] = iVar10;
                        piVar18[3] = iVar11;
                        *(size_t *)((long)&pMVar8->cstep + lVar19) = pBVar4[iVar3].shape.cstep;
                        iVar14 = local_ce4;
                      }
                      lVar17 = lVar17 + 1;
                      lVar19 = lVar19 + 0x40;
                    } while (lVar17 < iVar14);
                  }
                  pLVar12 = local_c90;
                  iVar14 = (*local_c90->_vptr_Layer[2])(local_c90,&local_930);
                  if (iVar14 == 0) {
                    (local_c48->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                    _M_impl.super__Vector_impl_data._M_start[local_cdc] = pLVar12;
                    iVar14 = 0;
                  }
                  else {
                    load_param();
                    iVar14 = 0xe;
                  }
                  dr = local_c68;
                  if (local_c38[0].refcount != (int *)0x0) {
                    LOCK();
                    *local_c38[0].refcount = *local_c38[0].refcount + -1;
                    UNLOCK();
                    if (*local_c38[0].refcount == 0) {
                      if (local_c38[0].allocator == (Allocator *)0x0) {
                        if ((size_t *)local_c38[0].data != (size_t *)0x0) {
                          free(local_c38[0].data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_c38[0].allocator + 0x18))();
                      }
                    }
                  }
                  if ((iVar14 != 0xe) && (iVar14 != 0)) goto LAB_0012c930;
                }
                else {
                  fwrite("ParamDict load_param failed",0x1b,1,_stderr);
                  fputc(10,_stderr);
                }
                local_cdc = local_cdc + 1;
              } while (local_cdc < local_c84);
            }
            iVar14 = 0;
LAB_0012c935:
            lVar17 = 0x8c0;
            do {
              piVar18 = *(int **)((long)&local_930.params[0].v.data + lVar17);
              if (piVar18 != (int *)0x0) {
                LOCK();
                *piVar18 = *piVar18 + -1;
                UNLOCK();
                if (*piVar18 == 0) {
                  pvVar6 = *(void **)((long)&local_930.params[0].type + lVar17);
                  plVar9 = *(long **)((long)&local_930.params[0].v.elempack + lVar17);
                  if (plVar9 == (long *)0x0) {
                    if (pvVar6 != (void *)0x0) {
                      free(pvVar6);
                    }
                  }
                  else {
                    (**(code **)(*plVar9 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar17 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar17 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar17) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar17) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar17) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar17) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar17) = 0;
              lVar17 = lVar17 + -0x48;
            } while (lVar17 != -0x40);
            return iVar14;
          }
          load_param();
        }
        else {
          load_param();
        }
      }
      else {
        load_param();
      }
    }
    else {
      load_param();
    }
  }
  else {
    load_param();
  }
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        NCNN_LOGE("parse " #v " failed"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}